

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void nn_timer_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  nn_fsm *extraout_RAX;
  
  if (type != -3 || src != -2) {
    if (*(int *)&self[1].fn == 3) {
      nn_timer_shutdown_cold_2();
      return;
    }
    nn_timer_shutdown_cold_1();
    self = extraout_RAX;
  }
  *(undefined4 *)&self[1].fn = 3;
  nn_worker_execute((nn_worker *)self[2].ctx,(nn_worker_task *)&self[1].owner);
  return;
}

Assistant:

static void nn_timer_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_timer *timer;

    timer = nn_cont (self, struct nn_timer, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        timer->state = NN_TIMER_STATE_STOPPING;
        nn_worker_execute (timer->worker, &timer->stop_task);
        return;
    }
    if (nn_slow (timer->state == NN_TIMER_STATE_STOPPING)) {
        if (src != NN_TIMER_SRC_STOP_TASK)
            return;
        nn_assert (type == NN_WORKER_TASK_EXECUTE);
        nn_worker_rm_timer (timer->worker, &timer->wtimer);
        timer->state = NN_TIMER_STATE_IDLE;
        nn_fsm_stopped (&timer->fsm, NN_TIMER_STOPPED);
        return;
    }

    nn_fsm_bad_state(timer->state, src, type);
}